

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkDepends.cxx
# Opt level: O2

int __thiscall cmComputeLinkDepends::AddLinkEntry(cmComputeLinkDepends *this,cmLinkItem *item)

{
  pointer pLVar1;
  _Alloc_hider _Var2;
  bool bVar3;
  iterator iVar4;
  iterator iVar5;
  cmGeneratorTarget *pcVar6;
  char *pcVar7;
  DependSetList *pDVar8;
  int iVar9;
  pointer pLVar10;
  BFSEntry qe;
  BFSEntry qe_1;
  
  iVar4 = std::
          _Rb_tree<cmLinkItem,_std::pair<const_cmLinkItem,_int>,_std::_Select1st<std::pair<const_cmLinkItem,_int>_>,_std::less<cmLinkItem>,_std::allocator<std::pair<const_cmLinkItem,_int>_>_>
          ::find(&(this->LinkEntryIndex)._M_t,item);
  if ((_Rb_tree_header *)iVar4._M_node == &(this->LinkEntryIndex)._M_t._M_impl.super__Rb_tree_header
     ) {
    iVar5 = AllocateLinkEntry(this,item);
    iVar9 = *(int *)&iVar5._M_node[2]._M_right;
    pLVar1 = (this->EntryList).
             super__Vector_base<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pLVar10 = pLVar1 + iVar9;
    cmLinkItem::AsStr_abi_cxx11_(item);
    std::__cxx11::string::_M_assign((string *)pLVar10);
    pcVar6 = item->Target;
    pLVar1[iVar9].Target = pcVar6;
    if (((pcVar6 == (cmGeneratorTarget *)0x0) &&
        (_Var2._M_p = (pLVar10->Item)._M_dataplus._M_p, *_Var2._M_p == '-')) &&
       (_Var2._M_p[1] != 'l')) {
      std::__cxx11::string::substr((ulong)&qe,(ulong)pLVar10);
      bVar3 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &qe,"-framework");
      pLVar10->IsFlag = bVar3;
      std::__cxx11::string::~string((string *)&qe);
      pcVar6 = pLVar10->Target;
    }
    else {
      pLVar10->IsFlag = false;
    }
    if (pcVar6 == (cmGeneratorTarget *)0x0) {
      std::__cxx11::string::string((string *)&qe,(string *)pLVar10);
      std::__cxx11::string::append((char *)&qe);
      pcVar7 = cmMakefile::GetDefinition(this->Makefile,(string *)&qe);
      if (pcVar7 == (char *)0x0) {
        if (pLVar10->IsFlag == false) {
          pDVar8 = (DependSetList *)operator_new(0x18);
          *(pointer *)
           ((long)&(pDVar8->
                   super_vector<cmComputeLinkDepends::DependSet,_std::allocator<cmComputeLinkDepends::DependSet>_>
                   ).
                   super__Vector_base<cmComputeLinkDepends::DependSet,_std::allocator<cmComputeLinkDepends::DependSet>_>
                   ._M_impl + 0x10) = (pointer)0x0;
          *(undefined8 *)
           &(pDVar8->
            super_vector<cmComputeLinkDepends::DependSet,_std::allocator<cmComputeLinkDepends::DependSet>_>
            ).
            super__Vector_base<cmComputeLinkDepends::DependSet,_std::allocator<cmComputeLinkDepends::DependSet>_>
            ._M_impl = 0;
          *(pointer *)
           ((long)&(pDVar8->
                   super_vector<cmComputeLinkDepends::DependSet,_std::allocator<cmComputeLinkDepends::DependSet>_>
                   ).
                   super__Vector_base<cmComputeLinkDepends::DependSet,_std::allocator<cmComputeLinkDepends::DependSet>_>
                   ._M_impl + 8) = (pointer)0x0;
          (this->InferredDependSets).
          super__Vector_base<cmComputeLinkDepends::DependSetList_*,_std::allocator<cmComputeLinkDepends::DependSetList_*>_>
          ._M_impl.super__Vector_impl_data._M_start[iVar9] = pDVar8;
        }
      }
      else {
        qe_1.Index = iVar9;
        qe_1.LibDepends = pcVar7;
        std::deque<cmComputeLinkDepends::BFSEntry,_std::allocator<cmComputeLinkDepends::BFSEntry>_>
        ::push_back(&(this->BFSQueue).c,&qe_1);
      }
      std::__cxx11::string::~string((string *)&qe);
    }
    else {
      qe.LibDepends = (char *)0x0;
      qe.Index = iVar9;
      std::deque<cmComputeLinkDepends::BFSEntry,_std::allocator<cmComputeLinkDepends::BFSEntry>_>::
      push_back(&(this->BFSQueue).c,&qe);
    }
  }
  else {
    iVar9 = *(int *)&iVar4._M_node[2]._M_right;
  }
  return iVar9;
}

Assistant:

int cmComputeLinkDepends::AddLinkEntry(cmLinkItem const& item)
{
  // Check if the item entry has already been added.
  std::map<cmLinkItem, int>::iterator lei = this->LinkEntryIndex.find(item);
  if (lei != this->LinkEntryIndex.end()) {
    // Yes.  We do not need to follow the item's dependencies again.
    return lei->second;
  }

  // Allocate a spot for the item entry.
  lei = this->AllocateLinkEntry(item);

  // Initialize the item entry.
  int index = lei->second;
  LinkEntry& entry = this->EntryList[index];
  entry.Item = item.AsStr();
  entry.Target = item.Target;
  entry.IsFlag =
    (!entry.Target && entry.Item[0] == '-' && entry.Item[1] != 'l' &&
     entry.Item.substr(0, 10) != "-framework");

  // If the item has dependencies queue it to follow them.
  if (entry.Target) {
    // Target dependencies are always known.  Follow them.
    BFSEntry qe = { index, nullptr };
    this->BFSQueue.push(qe);
  } else {
    // Look for an old-style <item>_LIB_DEPENDS variable.
    std::string var = entry.Item;
    var += "_LIB_DEPENDS";
    if (const char* val = this->Makefile->GetDefinition(var)) {
      // The item dependencies are known.  Follow them.
      BFSEntry qe = { index, val };
      this->BFSQueue.push(qe);
    } else if (!entry.IsFlag) {
      // The item dependencies are not known.  We need to infer them.
      this->InferredDependSets[index] = new DependSetList;
    }
  }

  return index;
}